

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v10::detail::format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_arg_id
          (format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *this,
          basic_string_view<char> id)

{
  format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *this_local;
  basic_string_view<char> id_local;
  
  on_error(this,"compile-time checks for named arguments require C++20 support");
  return 0;
}

Assistant:

FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
#if FMT_USE_NONTYPE_TEMPLATE_ARGS
    auto index = get_arg_index_by_name<Args...>(id);
    if (index < 0) on_error("named argument is not found");
    return index;
#else
    (void)id;
    on_error("compile-time checks for named arguments require C++20 support");
    return 0;
#endif
  }